

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_BIZARRE(effect_handler_context_t_conflict *context)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  anon_enum_32 aVar4;
  wchar_t rad;
  anon_union_8_4_b62eeb40_for_which_conflict aVar5;
  int iVar6;
  wchar_t dam;
  source sVar7;
  source origin;
  wchar_t flg;
  object *obj;
  loc target;
  
  context->ident = true;
  uVar3 = Rand_div(10);
  switch(uVar3) {
  case 0:
  case 1:
    msg("You are surrounded by a malignant aura.");
    player_stat_dec(player,L'\0',true);
    player_stat_dec(player,L'\x01',true);
    player_stat_dec(player,L'\x02',true);
    player_stat_dec(player,L'\x03',true);
    player_stat_dec(player,L'\x04',true);
    iVar1 = player->exp;
    iVar6 = iVar1 + 3;
    if (-1 < iVar1) {
      iVar6 = iVar1;
    }
    player_exp_lose(player,iVar6 >> 2,true);
    break;
  case 2:
    msg("You are surrounded by a powerful aura.");
    origin._4_4_ = 0;
    origin.what = (context->origin).what;
    origin.which.trap = (context->origin).which.trap;
    effect_simple(L'2',origin,"1000",L'*',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    break;
  case 3:
  case 4:
  case 5:
    target = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[context->dir]);
    flg = L'|';
    if ((context->dir == 5) && (_Var2 = target_okay(), _Var2)) {
      target_get((loc_conflict *)&target);
      flg = L'p';
    }
    sVar7 = source_player();
    aVar5 = sVar7.which;
    aVar4 = sVar7.what;
    rad = L'\x03';
    dam = L'Ĭ';
    obj = context->obj;
    goto LAB_001417ce;
  case 6:
  case 7:
  case 8:
  case 9:
    target = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[context->dir]);
    if ((context->dir == 5) && (_Var2 = target_okay(), _Var2)) {
      target_get((loc_conflict *)&target);
    }
    sVar7 = source_player();
    aVar5 = sVar7.which;
    aVar4 = sVar7.what;
    rad = L'\0';
    dam = L'ú';
    obj = context->obj;
    flg = L'L';
LAB_001417ce:
    sVar7._4_4_ = 0;
    sVar7.what = aVar4;
    sVar7.which.trap = aVar5.trap;
    _Var2 = project(sVar7,rad,target,dam,L'\x16',flg,L'\0','\0',obj);
    return _Var2;
  default:
    return false;
  }
  return true;
}

Assistant:

bool effect_handler_BIZARRE(effect_handler_context_t *context)
{
	context->ident = true;

	/* Pick a random effect */
	switch (randint1(10))
	{
		case 1:
		case 2:
		{
			/* Message */
			msg("You are surrounded by a malignant aura.");

			/* Decrease all stats (permanently) */
			player_stat_dec(player, STAT_STR, true);
			player_stat_dec(player, STAT_INT, true);
			player_stat_dec(player, STAT_WIS, true);
			player_stat_dec(player, STAT_DEX, true);
			player_stat_dec(player, STAT_CON, true);

			/* Lose some experience (permanently) */
			player_exp_lose(player, player->exp / 4, true);

			return true;
		}

		case 3:
		{
			/* Message */
			msg("You are surrounded by a powerful aura.");

			/* Dispel monsters */
			effect_simple(EF_PROJECT_LOS, context->origin, "1000", PROJ_DISP_ALL, 0, 0, 0, 0, NULL);

			return true;
		}

		case 4:
		case 5:
		case 6:
		{
			/* Mana Ball */
			int flg = PROJECT_THRU | PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;
			struct loc target = loc_sum(player->grid, ddgrid[context->dir]);

			/* Ask for a target if no direction given */
			if ((context->dir == DIR_TARGET) && target_okay()) {
				flg &= ~(PROJECT_STOP | PROJECT_THRU);

				target_get(&target);
			}

			/* Aim at the target, explode */
			return (project(source_player(), 3, target, 300, PROJ_MANA, flg, 0,
							0, context->obj));
		}

		case 7:
		case 8:
		case 9:
		case 10:
		{
			/* Mana Bolt */
			int flg = PROJECT_STOP | PROJECT_KILL | PROJECT_THRU;
			struct loc target = loc_sum(player->grid, ddgrid[context->dir]);

			/* Use an actual target */
			if ((context->dir == DIR_TARGET) && target_okay())
				target_get(&target);

			/* Aim at the target, do NOT explode */
			return project(source_player(), 0, target, 250, PROJ_MANA, flg, 0,
						   0, context->obj);
		}
	}

	return false;
}